

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.cpp
# Opt level: O0

void __thiscall OpenMD::Torsion::calcForce(Torsion *this,RealType *angle,bool doParticlePot)

{
  reference ppAVar1;
  byte in_DL;
  double *in_RSI;
  long in_RDI;
  double dVar2;
  Vector3d dcosdB;
  Vector3d dcosdA;
  Vector3d f3;
  Vector3d f2;
  Vector3d f1;
  RealType dVdcosPhi;
  RealType cos_phi;
  RealType rB;
  Vector3d B;
  RealType rA;
  Vector3d A;
  Vector3d r43;
  Vector3d r32;
  Vector3d r21;
  Vector3d pos4;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> *in_stack_fffffffffffffc18;
  Vector<double,_3U> *v;
  Vector<double,_3U> *in_stack_fffffffffffffc20;
  Vector<double,_3U> *v2;
  StuntDouble *in_stack_fffffffffffffc28;
  StuntDouble *in_stack_fffffffffffffc30;
  value_type this_00;
  Vector3<double> *in_stack_fffffffffffffc80;
  Vector3<double> *in_stack_fffffffffffffc88;
  Vector3d *in_stack_fffffffffffffc98;
  Snapshot *in_stack_fffffffffffffca0;
  Vector<double,_3U> *local_158;
  double local_150;
  double local_148;
  double local_128;
  byte local_11;
  double *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),0);
  StuntDouble::getPos(in_stack_fffffffffffffc28);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),1);
  StuntDouble::getPos(in_stack_fffffffffffffc28);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),2);
  StuntDouble::getPos(in_stack_fffffffffffffc28);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),3);
  StuntDouble::getPos(in_stack_fffffffffffffc28);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 8));
  Snapshot::wrapVector(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 8));
  Snapshot::wrapVector(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
  Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 8));
  Snapshot::wrapVector(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  cross<double>(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  local_128 = Vector<double,_3U>::length((Vector<double,_3U> *)0x2d5a3f);
  cross<double>(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
  local_148 = Vector<double,_3U>::length((Vector<double,_3U> *)0x2d5a72);
  if (1e-06 <= local_128 * local_148) {
    Vector<double,_3U>::normalize(in_stack_fffffffffffffc20);
    Vector<double,_3U>::normalize(in_stack_fffffffffffffc20);
    local_150 = dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffffc30,
                               (Vector<double,_3U> *)in_stack_fffffffffffffc28);
    if (1.0 < local_150) {
      local_150 = 1.0;
    }
    if (local_150 < -1.0) {
      local_150 = -1.0;
    }
    (**(code **)(**(long **)(in_RDI + 0x68) + 0x10))
              (local_150,*(long **)(in_RDI + 0x68),in_RDI + 0x90,&local_158);
    Vector3<double>::Vector3((Vector3<double> *)0x2d5b58);
    Vector3<double>::Vector3((Vector3<double> *)0x2d5b65);
    Vector3<double>::Vector3((Vector3<double> *)0x2d5b72);
    OpenMD::operator*((double)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    operator/((Vector<double,_3U> *)in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18)
    ;
    OpenMD::operator*((double)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    operator/((Vector<double,_3U> *)in_stack_fffffffffffffc28,(double)in_stack_fffffffffffffc20);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18)
    ;
    v = local_158;
    cross<double>(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    OpenMD::operator*((double)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    v2 = local_158;
    cross<double>(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    cross<double>(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffc28,v2);
    OpenMD::operator*((double)in_stack_fffffffffffffc28,v2);
    Vector3<double>::operator=((Vector3<double> *)in_stack_fffffffffffffc28,v2);
    cross<double>(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    OpenMD::operator*((double)local_158,v2);
    Vector3<double>::operator=((Vector3<double> *)local_158,v2);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),0);
    StuntDouble::addFrc(in_stack_fffffffffffffc30,(Vector3d *)local_158);
    ppAVar1 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),
                         1);
    this_00 = *ppAVar1;
    OpenMD::operator-(local_158,v2);
    Vector3<double>::Vector3((Vector3<double> *)v2,v);
    StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)local_158);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),2);
    OpenMD::operator-(local_158,v2);
    Vector3<double>::Vector3((Vector3<double> *)v2,v);
    StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)local_158);
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),3);
    OpenMD::operator-(local_158);
    Vector3<double>::Vector3((Vector3<double> *)v2,v);
    StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)local_158);
    if ((local_11 & 1) != 0) {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),0);
      StuntDouble::addParticlePot(&this_00->super_StuntDouble,local_158->data_);
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),1);
      StuntDouble::addParticlePot(&this_00->super_StuntDouble,local_158->data_);
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),2);
      StuntDouble::addParticlePot(&this_00->super_StuntDouble,local_158->data_);
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x10),3);
      StuntDouble::addParticlePot(&this_00->super_StuntDouble,local_158->data_);
    }
    dVar2 = acos(local_150);
    *local_10 = (dVar2 / 3.141592653589793) * 180.0;
  }
  return;
}

Assistant:

void Torsion::calcForce(RealType& angle, bool doParticlePot) {
    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = atoms_[1]->getPos();
    Vector3d pos3 = atoms_[2]->getPos();
    Vector3d pos4 = atoms_[3]->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    Vector3d r32 = pos2 - pos3;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r32);
    Vector3d r43 = pos3 - pos4;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r43);

    //  Calculate the cross products and distances
    Vector3d A  = cross(r21, r32);
    RealType rA = A.length();
    Vector3d B  = cross(r32, r43);
    RealType rB = B.length();

    /*
     If either of the two cross product vectors is tiny, that means
     the three atoms involved are colinear, and the torsion angle is
     going to be undefined.  The easiest check for this problem is
     to use the product of the two lengths.
  */
    if (rA * rB < OpenMD::epsilon) return;

    A.normalize();
    B.normalize();

    //  Calculate the sin and cos
    RealType cos_phi = dot(A, B);
    if (cos_phi > 1.0) cos_phi = 1.0;
    if (cos_phi < -1.0) cos_phi = -1.0;

    RealType dVdcosPhi;
    torsionType_->calcForce(cos_phi, potential_, dVdcosPhi);
    Vector3d f1;
    Vector3d f2;
    Vector3d f3;

    Vector3d dcosdA = (cos_phi * A - B) / rA;
    Vector3d dcosdB = (cos_phi * B - A) / rB;

    f1 = dVdcosPhi * cross(r32, dcosdA);
    f2 = dVdcosPhi * (cross(r43, dcosdB) - cross(r21, dcosdA));
    f3 = dVdcosPhi * cross(dcosdB, r32);

    atoms_[0]->addFrc(f1);
    atoms_[1]->addFrc(f2 - f1);
    atoms_[2]->addFrc(f3 - f2);
    atoms_[3]->addFrc(-f3);

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      atoms_[2]->addParticlePot(potential_);
      atoms_[3]->addParticlePot(potential_);
    }

    angle = acos(cos_phi) / Constants::PI * 180.0;
  }